

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  uint64_t scopeId;
  CapTableReader *pCVar4;
  int iVar5;
  uint uVar6;
  uint64_t replacementScopeId;
  undefined1 local_b8 [48];
  undefined1 local_88 [56];
  PointerReader local_50;
  
  if ((node->_reader).dataSize < 0x70) {
    sVar3 = 0;
  }
  else {
    sVar3 = *(short *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    sVar2 = 0;
  }
  else {
    sVar2 = *(short *)((long)(replacement->_reader).data + 0xc);
  }
  if (sVar3 == sVar2) {
    iVar5 = 0x7fffffff;
    if ((replacement->_reader).pointerCount < 6) {
      local_b8._8_8_ = (CapTableReader *)0x0;
      local_b8._16_8_ = (WirePointer *)0x0;
      local_b8._0_8_ = (SegmentReader *)0x0;
      uVar6 = 0x7fffffff;
    }
    else {
      local_b8._0_8_ = (replacement->_reader).segment;
      local_b8._8_8_ = (replacement->_reader).capTable;
      local_b8._16_8_ = (replacement->_reader).pointers + 5;
      uVar6 = (replacement->_reader).nestingLimit;
    }
    pCVar4 = (CapTableReader *)0x0;
    local_b8._24_4_ = uVar6;
    capnp::_::PointerReader::getList
              ((ListReader *)local_88,(PointerReader *)local_b8,INLINE_COMPOSITE,(word *)0x0);
    uVar1 = local_88._24_4_;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    if (5 < (node->_reader).pointerCount) {
      local_50.segment = (node->_reader).segment;
      pCVar4 = (node->_reader).capTable;
      local_50.pointer = (node->_reader).pointers + 5;
      iVar5 = (node->_reader).nestingLimit;
    }
    local_50.capTable = pCVar4;
    local_50.nestingLimit = iVar5;
    capnp::_::PointerReader::getList((ListReader *)local_b8,&local_50,INLINE_COMPOSITE,(word *)0x0);
    if ((uint)local_b8._24_4_ < (uint)uVar1) {
      replacementIsNewer(this);
    }
    else {
      iVar5 = 0x7fffffff;
      if ((replacement->_reader).pointerCount < 6) {
        local_b8._8_8_ = (CapTableReader *)0x0;
        local_b8._16_8_ = (WirePointer *)0x0;
        local_b8._0_8_ = (SegmentReader *)0x0;
        local_b8._24_4_ = 0x7fffffff;
      }
      else {
        local_b8._0_8_ = (replacement->_reader).segment;
        local_b8._8_8_ = (replacement->_reader).capTable;
        local_b8._16_8_ = (replacement->_reader).pointers + 5;
        local_b8._24_4_ = (replacement->_reader).nestingLimit;
      }
      pCVar4 = (CapTableReader *)0x0;
      capnp::_::PointerReader::getList
                ((ListReader *)local_88,(PointerReader *)local_b8,INLINE_COMPOSITE,(word *)0x0);
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)0x0;
      if (5 < (node->_reader).pointerCount) {
        local_50.segment = (node->_reader).segment;
        pCVar4 = (node->_reader).capTable;
        local_50.pointer = (node->_reader).pointers + 5;
        iVar5 = (node->_reader).nestingLimit;
      }
      local_50.capTable = pCVar4;
      local_50.nestingLimit = iVar5;
      capnp::_::PointerReader::getList
                ((ListReader *)local_b8,&local_50,INLINE_COMPOSITE,(word *)0x0);
      if ((uint)local_88._24_4_ < (uint)local_b8._24_4_) {
        replacementIsOlder(this);
      }
    }
    uVar6 = (node->_reader).dataSize;
    if (uVar6 < 0x70) {
      sVar3 = 0;
    }
    else {
      sVar3 = *(short *)((long)(node->_reader).data + 0xc);
    }
    if (sVar3 == 3) {
      local_88._0_8_ = (node->_reader).segment;
      local_88._8_8_ = (node->_reader).capTable;
      local_88._16_8_ = (node->_reader).data;
      local_88._24_8_ = (node->_reader).pointers;
      local_88._32_4_ = (node->_reader).dataSize;
      local_88._36_2_ = (node->_reader).pointerCount;
      local_88[0x26] = (node->_reader).field_0x26;
      local_88[0x27] = (node->_reader).field_0x27;
      local_88._40_4_ = (node->_reader).nestingLimit;
      local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      local_b8._0_8_ = (replacement->_reader).segment;
      local_b8._8_8_ = (replacement->_reader).capTable;
      local_b8._16_8_ = (replacement->_reader).data;
      local_b8._24_8_ = (replacement->_reader).pointers;
      local_b8._32_4_ = (replacement->_reader).dataSize;
      local_b8._36_2_ = (replacement->_reader).pointerCount;
      local_b8[0x26] = (replacement->_reader).field_0x26;
      local_b8[0x27] = (replacement->_reader).field_0x27;
      local_b8._40_4_ = (replacement->_reader).nestingLimit;
      local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
      checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8);
    }
    else if (sVar3 == 2) {
      local_88._0_8_ = (node->_reader).segment;
      local_88._8_8_ = (node->_reader).capTable;
      local_88._16_8_ = (node->_reader).data;
      local_88._24_8_ = (node->_reader).pointers;
      local_88._32_4_ = (node->_reader).dataSize;
      local_88._36_2_ = (node->_reader).pointerCount;
      local_88[0x26] = (node->_reader).field_0x26;
      local_88[0x27] = (node->_reader).field_0x27;
      local_88._40_4_ = (node->_reader).nestingLimit;
      local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      local_b8._0_8_ = (replacement->_reader).segment;
      local_b8._8_8_ = (replacement->_reader).capTable;
      local_b8._16_8_ = (replacement->_reader).data;
      local_b8._24_8_ = (replacement->_reader).pointers;
      local_b8._32_4_ = (replacement->_reader).dataSize;
      local_b8._36_2_ = (replacement->_reader).pointerCount;
      local_b8[0x26] = (replacement->_reader).field_0x26;
      local_b8[0x27] = (replacement->_reader).field_0x27;
      local_b8._40_4_ = (replacement->_reader).nestingLimit;
      local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
      checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8);
    }
    else if (sVar3 == 1) {
      local_88._0_8_ = (node->_reader).segment;
      local_88._8_8_ = (node->_reader).capTable;
      local_88._16_8_ = (node->_reader).data;
      local_88._24_8_ = (node->_reader).pointers;
      local_88._32_4_ = (node->_reader).dataSize;
      local_88._36_2_ = (node->_reader).pointerCount;
      local_88[0x26] = (node->_reader).field_0x26;
      local_88[0x27] = (node->_reader).field_0x27;
      local_88._40_4_ = (node->_reader).nestingLimit;
      local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      local_b8._0_8_ = (replacement->_reader).segment;
      local_b8._8_8_ = (replacement->_reader).capTable;
      local_b8._16_8_ = (replacement->_reader).data;
      local_b8._24_8_ = (replacement->_reader).pointers;
      local_b8._32_4_ = (replacement->_reader).dataSize;
      local_b8._36_2_ = (replacement->_reader).pointerCount;
      local_b8[0x26] = (replacement->_reader).field_0x26;
      local_b8[0x27] = (replacement->_reader).field_0x27;
      local_b8._40_4_ = (replacement->_reader).nestingLimit;
      local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
      if (uVar6 < 0xc0) {
        scopeId = 0;
      }
      else {
        scopeId = *(uint64_t *)((long)(node->_reader).data + 0x10);
      }
      if ((replacement->_reader).dataSize < 0xc0) {
        replacementScopeId = 0;
      }
      else {
        replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8,scopeId,replacementScopeId);
    }
  }
  else {
    checkCompatibility(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }